

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall spv::Builder::makeHitObjectNVType(Builder *this)

{
  Id IVar1;
  mapped_type *pmVar2;
  size_type sVar3;
  Instruction *this_00;
  reference ppIVar4;
  key_type local_2c;
  value_type local_28;
  key_type local_20 [2];
  Instruction *local_18;
  Instruction *type;
  Builder *this_local;
  
  local_20[1] = 0x14a1;
  type = (Instruction *)this;
  pmVar2 = std::
           unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
           ::operator[](&this->groupedTypes,local_20 + 1);
  sVar3 = std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::size(pmVar2);
  if (sVar3 == 0) {
    this_00 = (Instruction *)::operator_new(0x60);
    IVar1 = getUniqueId(this);
    spv::Instruction::Instruction(this_00,IVar1,0,OpTypeHitObjectNV);
    local_20[0] = 0x14a1;
    local_18 = this_00;
    pmVar2 = std::
             unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
             ::operator[](&this->groupedTypes,local_20);
    std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::push_back
              (pmVar2,&local_18);
    std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
    unique_ptr<std::default_delete<spv::Instruction>,void>
              ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_28,
               local_18);
    std::
    vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ::push_back(&this->constantsTypesGlobals,&local_28);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_28);
    Module::mapInstruction(&this->module,local_18);
  }
  else {
    local_2c = 0x14a1;
    pmVar2 = std::
             unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
             ::operator[](&this->groupedTypes,&local_2c);
    ppIVar4 = std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::back(pmVar2);
    local_18 = *ppIVar4;
  }
  IVar1 = spv::Instruction::getResultId(local_18);
  return IVar1;
}

Assistant:

Id Builder::makeHitObjectNVType()
{
    Instruction *type;
    if (groupedTypes[OpTypeHitObjectNV].size() == 0) {
        type = new Instruction(getUniqueId(), NoType, OpTypeHitObjectNV);
        groupedTypes[OpTypeHitObjectNV].push_back(type);
        constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(type));
        module.mapInstruction(type);
    } else {
        type = groupedTypes[OpTypeHitObjectNV].back();
    }

    return type->getResultId();
}